

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA5Application.cpp
# Opt level: O0

void PA5Application::resize(GLFWwindow *window,int framebufferWidth,int framebufferHeight)

{
  mat<4,_4,_float,_(glm::qualifier)0> local_64;
  float local_24;
  void *pvStack_20;
  float aspect;
  PA5Application *app;
  int framebufferHeight_local;
  int framebufferWidth_local;
  GLFWwindow *window_local;
  
  app._0_4_ = framebufferHeight;
  app._4_4_ = framebufferWidth;
  _framebufferHeight_local = window;
  pvStack_20 = glfwGetWindowUserPointer(window);
  local_24 = (float)app._4_4_ / (float)(int)app;
  glm::perspective<float>(&local_64,120.0,local_24,0.1,100.0);
  memcpy((void *)((long)pvStack_20 + 0x20),&local_64,0x40);
  glViewport(0,0,app._4_4_,(int)app);
  return;
}

Assistant:

void PA5Application::resize(GLFWwindow * window, int framebufferWidth, int framebufferHeight)
{
  PA5Application & app = *static_cast<PA5Application *>(glfwGetWindowUserPointer(window));
  float aspect = framebufferWidth / float(framebufferHeight);
  app.m_proj = glm::perspective(120.f, aspect, 0.1f, 100.f);
  glViewport(0, 0, framebufferWidth, framebufferHeight);
}